

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseNumericLiteral(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    *this,bool isNegative)

{
  bool bVar1;
  CompileMessage local_a0;
  CompileMessage local_58;
  byte local_19;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *pTStack_18;
  bool isNegative_local;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *this_local;
  
  local_19 = isNegative;
  pTStack_18 = this;
  bVar1 = parseHexLiteral(this);
  if (bVar1) {
    this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  *)checkIntLiteralRange(this,(bool)(local_19 & 1));
  }
  else {
    bVar1 = parseFloatLiteral(this);
    if (bVar1) {
      this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    *)(this->literalType).text;
    }
    else {
      bVar1 = parseOctalLiteral(this);
      if (bVar1) {
        Errors::noOctalLiterals<>();
        (*this->_vptr_Tokeniser[2])(this,&local_58);
        CompileMessage::~CompileMessage(&local_58);
      }
      bVar1 = parseBinaryLiteral(this);
      if (bVar1) {
        this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)checkIntLiteralRange(this,(bool)(local_19 & 1));
      }
      else {
        bVar1 = parseDecimalLiteral(this);
        if (bVar1) {
          this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)checkIntLiteralRange(this,(bool)(local_19 & 1));
        }
        else {
          Errors::errorInNumericLiteral<>();
          (*this->_vptr_Tokeniser[2])();
          CompileMessage::~CompileMessage(&local_a0);
          memset(&this_local,0,8);
          TokenType::TokenType((TokenType *)&this_local);
        }
      }
    }
  }
  return (TokenType)(char *)this_local;
}

Assistant:

TokenType parseNumericLiteral (bool isNegative)
    {
        if (parseHexLiteral())      return checkIntLiteralRange (isNegative);
        if (parseFloatLiteral())    return literalType;
        if (parseOctalLiteral())    throwError (Errors::noOctalLiterals());
        if (parseBinaryLiteral())   return checkIntLiteralRange (isNegative);
        if (parseDecimalLiteral())  return checkIntLiteralRange (isNegative);

        throwError (Errors::errorInNumericLiteral());
        return {};
    }